

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O0

bool ImGui_ImplOpenGL3_Init(char *glsl_version)

{
  ImGuiIO *pIVar1;
  char *in_RDI;
  ImGuiIO *io;
  char *local_8;
  
  pIVar1 = ImGui::GetIO();
  pIVar1->BackendRendererName = "imgui_impl_opengl3";
  local_8 = in_RDI;
  if (in_RDI == (char *)0x0) {
    local_8 = "#version 130";
  }
  strcpy(g_GlslVersionString,local_8);
  strcat(g_GlslVersionString,"\n");
  return true;
}

Assistant:

bool    ImGui_ImplOpenGL3_Init(const char* glsl_version)
{
    ImGuiIO& io = ImGui::GetIO();
    io.BackendRendererName = "imgui_impl_opengl3";

    // Store GLSL version string so we can refer to it later in case we recreate shaders. Note: GLSL version is NOT the same as GL version. Leave this to NULL if unsure.
#ifdef USE_GL_ES3
    if (glsl_version == NULL)
        glsl_version = "#version 300 es";
#else
    if (glsl_version == NULL)
        glsl_version = "#version 130";
#endif
    IM_ASSERT((int)strlen(glsl_version) + 2 < IM_ARRAYSIZE(g_GlslVersionString));
    strcpy(g_GlslVersionString, glsl_version);
    strcat(g_GlslVersionString, "\n");

    return true;
}